

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPSerializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BPSerializer::SerializeData(BPSerializer *this,IO *io,bool advanceStep)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  undefined7 in_register_00000011;
  allocator local_69;
  string local_68;
  string local_48;
  
  p_Var1 = this->_vptr_BPSerializer[-3];
  std::__cxx11::string::string((string *)&local_48,"buffering",&local_69);
  profiling::IOChrono::Start((IOChrono *)(&this->field_0x278 + (long)p_Var1),&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (*this->_vptr_BPSerializer[2])(this,io);
  pp_Var2 = this->_vptr_BPSerializer;
  if ((int)CONCAT71(in_register_00000011,advanceStep) != 0) {
    *(int *)(&this->field_0xe0 + (long)pp_Var2[-3]) =
         *(int *)(&this->field_0xe0 + (long)pp_Var2[-3]) + 1;
    *(long *)(&this->field_0x1d8 + (long)pp_Var2[-3]) =
         *(long *)(&this->field_0x1d8 + (long)pp_Var2[-3]) + 1;
  }
  p_Var1 = pp_Var2[-3];
  std::__cxx11::string::string((string *)&local_68,"buffering",&local_69);
  profiling::IOChrono::Stop((IOChrono *)(&this->field_0x278 + (long)p_Var1),&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void BPSerializer::SerializeData(core::IO &io, const bool advanceStep)
{
    m_Profiler.Start("buffering");
    SerializeDataBuffer(io);
    if (advanceStep)
    {
        ++m_MetadataSet.TimeStep;
        ++m_MetadataSet.CurrentStep;
    }
    m_Profiler.Stop("buffering");
}